

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::anon_unknown_59::Register(ExtensionInfo *info)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  long lVar3;
  ushort uVar4;
  ushort x;
  undefined1 auVar5 [16];
  MessageLite *pMVar6;
  EnumValidityFuncWithArg *pEVar7;
  void *pvVar8;
  LazyEagerVerifyFnType p_Var9;
  FieldType FVar10;
  bool bVar11;
  LazyAnnotation LVar12;
  bool bVar13;
  uint32_t uVar14;
  uint uVar15;
  int iVar16;
  CommonFields *common;
  anon_union_8_1_a8a14541_for_iterator_2 aVar17;
  reference key;
  anon_union_8_1_a8a14541_for_iterator_2 aVar18;
  LogMessage *pLVar19;
  flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *pfVar20;
  long lVar21;
  ulong extraout_RDX;
  ushort uVar22;
  size_t sVar23;
  ulong uVar24;
  PolicyFunctions *in_R9;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i match;
  undefined1 auVar29 [16];
  ctrl_t cVar30;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  ctrl_t cVar42;
  ctrl_t cVar43;
  ctrl_t cVar44;
  ctrl_t cVar45;
  ctrl_t cVar46;
  ctrl_t cVar47;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  string_view v;
  FindInfo target;
  probe_seq<16UL> local_98;
  int *local_80;
  ctrl_t local_78;
  ctrl_t cStack_77;
  ctrl_t cStack_76;
  ctrl_t cStack_75;
  ctrl_t cStack_74;
  ctrl_t cStack_73;
  ctrl_t cStack_72;
  ctrl_t cStack_71;
  ctrl_t cStack_70;
  ctrl_t cStack_6f;
  ctrl_t cStack_6e;
  ctrl_t cStack_6d;
  ctrl_t cStack_6c;
  ctrl_t cStack_6b;
  ctrl_t cStack_6a;
  ctrl_t cStack_69;
  undefined1 local_68 [16];
  const_iterator local_50;
  iterator local_40;
  
  if ((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
      local_static_registry == '\0') {
    iVar16 = __cxa_guard_acquire(&(anonymous_namespace)::
                                  Register(google::protobuf::internal::ExtensionInfo_const&)::
                                  local_static_registry);
    if (iVar16 != 0) {
      pfVar20 = (flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                 *)operator_new(0x20);
      (pfVar20->
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ).settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0;
      (pfVar20->
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ).settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      (pfVar20->
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ).settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      heap_or_soo_.heap.control = (ctrl_t *)0x386b60;
      OnShutdownRun(OnShutdownDelete<absl::lts_20250127::flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                    ::anon_class_1_0_00000001::__invoke,pfVar20);
      Register::local_static_registry = pfVar20;
      __cxa_guard_release(&(anonymous_namespace)::
                           Register(google::protobuf::internal::ExtensionInfo_const&)::
                           local_static_registry);
    }
  }
  pfVar20 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertOnFind<google::protobuf::internal::ExtensionInfo>
            (&Register::local_static_registry->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,info);
  local_80 = &info->number;
  common = (CommonFields *)
           absl::lts_20250127::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&info->message,local_80);
  absl::lts_20250127::container_internal::probe(&local_98,(CommonFields *)pfVar20,(size_t)common);
  pcVar2 = (pfVar20->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  auVar26 = ZEXT216(CONCAT11((char)common,(char)common) & 0x7f7f);
  auVar26 = pshuflw(auVar26,auVar26,0);
  uVar25 = auVar26._0_4_;
  auVar26._4_4_ = uVar25;
  auVar26._0_4_ = uVar25;
  auVar26._8_4_ = uVar25;
  auVar26._12_4_ = uVar25;
  aVar17 = (anon_union_8_1_a8a14541_for_iterator_2)local_98.offset_;
  while( true ) {
    pcVar1 = pcVar2 + (long)aVar17;
    auVar27[0] = -(auVar26[0] == *pcVar1);
    auVar27[1] = -(auVar26[1] == pcVar1[1]);
    auVar27[2] = -(auVar26[2] == pcVar1[2]);
    auVar27[3] = -(auVar26[3] == pcVar1[3]);
    auVar27[4] = -(auVar26[4] == pcVar1[4]);
    auVar27[5] = -(auVar26[5] == pcVar1[5]);
    auVar27[6] = -(auVar26[6] == pcVar1[6]);
    auVar27[7] = -(auVar26[7] == pcVar1[7]);
    auVar27[8] = -(auVar26[8] == pcVar1[8]);
    auVar27[9] = -(auVar26[9] == pcVar1[9]);
    auVar27[10] = -(auVar26[10] == pcVar1[10]);
    auVar27[0xb] = -(auVar26[0xb] == pcVar1[0xb]);
    auVar27[0xc] = -(auVar26[0xc] == pcVar1[0xc]);
    auVar27[0xd] = -(auVar26[0xd] == pcVar1[0xd]);
    auVar27[0xe] = -(auVar26[0xe] == pcVar1[0xe]);
    auVar27[0xf] = -(auVar26[0xf] == pcVar1[0xf]);
    cVar30 = *pcVar1;
    cVar33 = pcVar1[1];
    cVar34 = pcVar1[2];
    cVar35 = pcVar1[3];
    cVar36 = pcVar1[4];
    cVar37 = pcVar1[5];
    cVar38 = pcVar1[6];
    cVar39 = pcVar1[7];
    cVar40 = pcVar1[8];
    cVar41 = pcVar1[9];
    cVar42 = pcVar1[10];
    cVar43 = pcVar1[0xb];
    cVar44 = pcVar1[0xc];
    cVar45 = pcVar1[0xd];
    cVar46 = pcVar1[0xe];
    cVar47 = pcVar1[0xf];
    for (uVar22 = (ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar27[0xf] >> 7) << 0xf; uVar22 != 0; uVar22 = uVar22 - 1 & uVar22) {
      local_78 = cVar30;
      cStack_77 = cVar33;
      cStack_76 = cVar34;
      cStack_75 = cVar35;
      cStack_74 = cVar36;
      cStack_73 = cVar37;
      cStack_72 = cVar38;
      cStack_71 = cVar39;
      cStack_70 = cVar40;
      cStack_6f = cVar41;
      cStack_6e = cVar42;
      cStack_6d = cVar43;
      cStack_6c = cVar44;
      cStack_6b = cVar45;
      cStack_6a = cVar46;
      cStack_69 = cVar47;
      local_68 = auVar26;
      uVar14 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar22);
      lVar3 = *(long *)((long)&(pfVar20->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                               ).settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      sVar23 = local_98.offset_ + (ulong)uVar14 & local_98.mask_;
      if ((*(MessageLite **)(lVar3 + sVar23 * 0x30) == info->message) &&
         (*(int *)(lVar3 + 8 + sVar23 * 0x30) == info->number)) goto LAB_001a04ea;
      aVar17 = (anon_union_8_1_a8a14541_for_iterator_2)local_98.offset_;
      auVar26 = local_68;
      cVar30 = local_78;
      cVar33 = cStack_77;
      cVar34 = cStack_76;
      cVar35 = cStack_75;
      cVar36 = cStack_74;
      cVar37 = cStack_73;
      cVar38 = cStack_72;
      cVar39 = cStack_71;
      cVar40 = cStack_70;
      cVar41 = cStack_6f;
      cVar42 = cStack_6e;
      cVar43 = cStack_6d;
      cVar44 = cStack_6c;
      cVar45 = cStack_6b;
      cVar46 = cStack_6a;
      cVar47 = cStack_69;
    }
    auVar31[0] = -(cVar30 == kEmpty);
    auVar31[1] = -(cVar33 == kEmpty);
    auVar31[2] = -(cVar34 == kEmpty);
    auVar31[3] = -(cVar35 == kEmpty);
    auVar31[4] = -(cVar36 == kEmpty);
    auVar31[5] = -(cVar37 == kEmpty);
    auVar31[6] = -(cVar38 == kEmpty);
    auVar31[7] = -(cVar39 == kEmpty);
    auVar31[8] = -(cVar40 == kEmpty);
    auVar31[9] = -(cVar41 == kEmpty);
    auVar31[10] = -(cVar42 == kEmpty);
    auVar31[0xb] = -(cVar43 == kEmpty);
    auVar31[0xc] = -(cVar44 == kEmpty);
    auVar31[0xd] = -(cVar45 == kEmpty);
    auVar31[0xe] = -(cVar46 == kEmpty);
    auVar31[0xf] = -(cVar47 == kEmpty);
    x = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
        (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3
        | (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
        (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6
        | (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
        (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9
        | (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
        (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
        (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
        (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
        (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
    if (x != 0) break;
    uVar24 = local_98.index_ + 0x10;
    aVar17.slot_ = (slot_type *)((long)&(aVar17.slot_)->field_6 + local_98.index_ & local_98.mask_);
    local_98.offset_ = (size_t)aVar17.slot_;
    local_98.index_ = uVar24;
    if ((pfVar20->
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
        ).settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < uVar24) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                   );
    }
  }
  bVar13 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                     ((pfVar20->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                      ).settings_.
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.capacity_,(size_t)common,
                      (pfVar20->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                      ).settings_.
                      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                      .value.heap_or_soo_.heap.control);
  if (bVar13) {
    uVar4 = 0xf;
    if (x != 0) {
      for (; x >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar15 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
  }
  else {
    uVar15 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(x);
  }
  target.probe_length =
       (size_t)absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
               ::GetPolicyFunctions()::value;
  target.offset = local_98.index_;
  sVar23 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                     ((container_internal *)pfVar20,common,
                      local_98.offset_ + (ulong)uVar15 & local_98.mask_,target,in_R9);
LAB_001a04ea:
  local_40 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ::iterator_at(&pfVar20->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                           ,sVar23);
  aVar17 = local_40.field_1;
  if (uVar22 != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x65);
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        ((LogMessage *)&local_98,
                         (char (*) [44])"Multiple extension registrations for type \"");
    v = MessageLite::GetTypeName(info->message);
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar19,v);
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar19,(char (*) [17])"\", field number ");
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar19,*local_80);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar19,(char (*) [2])0x2d97d4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_98);
  }
  sVar23 = (pfVar20->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  (pfVar20->
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ).settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9c;
  pMVar6 = info->message;
  iVar16 = info->number;
  FVar10 = info->type;
  bVar13 = info->is_repeated;
  bVar11 = info->is_packed;
  LVar12 = info->is_lazy;
  pEVar7 = (info->field_6).enum_validity_check.func;
  pvVar8 = (info->field_6).enum_validity_check.arg;
  p_Var9 = info->lazy_eager_verify_func;
  (aVar17.slot_)->descriptor = info->descriptor;
  (aVar17.slot_)->lazy_eager_verify_func = p_Var9;
  ((aVar17.slot_)->field_6).enum_validity_check.func = pEVar7;
  ((aVar17.slot_)->field_6).enum_validity_check.arg = pvVar8;
  (aVar17.slot_)->message = pMVar6;
  *(int *)((long)aVar17 + 8) = iVar16;
  *(FieldType *)((long)aVar17 + 0xc) = FVar10;
  *(bool *)((long)aVar17 + 0xd) = bVar13;
  *(bool *)((long)aVar17 + 0xe) = bVar11;
  *(LazyAnnotation *)((long)aVar17 + 0xf) = LVar12;
  local_80 = (int *)local_40.ctrl_;
  absl::lts_20250127::container_internal::CommonFields::set_capacity((CommonFields *)pfVar20,sVar23)
  ;
  key = absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
        ::iterator::operator*(&local_40);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertOnFind<google::protobuf::internal::ExtensionInfo>
            (&pfVar20->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,key);
  sVar23 = absl::lts_20250127::HashOf<const_google::protobuf::MessageLite_*,_int>
                     (&key->message,&key->number);
  absl::lts_20250127::container_internal::probe(&local_98,(CommonFields *)pfVar20,sVar23);
  pcVar2 = (pfVar20->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  auVar26 = ZEXT216(CONCAT11((char)sVar23,(char)sVar23) & 0x7f7f);
  auVar26 = pshuflw(auVar26,auVar26,0);
  uVar25 = auVar26._0_4_;
  auVar29._4_4_ = uVar25;
  auVar29._0_4_ = uVar25;
  auVar29._8_4_ = uVar25;
  auVar29._12_4_ = uVar25;
  aVar18 = (anon_union_8_1_a8a14541_for_iterator_2)local_98.offset_;
  do {
    pcVar1 = pcVar2 + (long)aVar18;
    auVar28[0] = -(auVar29[0] == *pcVar1);
    auVar28[1] = -(auVar29[1] == pcVar1[1]);
    auVar28[2] = -(auVar29[2] == pcVar1[2]);
    auVar28[3] = -(auVar29[3] == pcVar1[3]);
    auVar28[4] = -(auVar29[4] == pcVar1[4]);
    auVar28[5] = -(auVar29[5] == pcVar1[5]);
    auVar28[6] = -(auVar29[6] == pcVar1[6]);
    auVar28[7] = -(auVar29[7] == pcVar1[7]);
    auVar28[8] = -(auVar29[8] == pcVar1[8]);
    auVar28[9] = -(auVar29[9] == pcVar1[9]);
    auVar28[10] = -(auVar29[10] == pcVar1[10]);
    auVar28[0xb] = -(auVar29[0xb] == pcVar1[0xb]);
    auVar28[0xc] = -(auVar29[0xc] == pcVar1[0xc]);
    auVar28[0xd] = -(auVar29[0xd] == pcVar1[0xd]);
    auVar28[0xe] = -(auVar29[0xe] == pcVar1[0xe]);
    auVar28[0xf] = -(auVar29[0xf] == pcVar1[0xf]);
    cVar30 = *pcVar1;
    cVar33 = pcVar1[1];
    cVar34 = pcVar1[2];
    cVar35 = pcVar1[3];
    cVar36 = pcVar1[4];
    cVar37 = pcVar1[5];
    cVar38 = pcVar1[6];
    cVar39 = pcVar1[7];
    cVar40 = pcVar1[8];
    cVar41 = pcVar1[9];
    cVar42 = pcVar1[10];
    cVar43 = pcVar1[0xb];
    cVar44 = pcVar1[0xc];
    cVar45 = pcVar1[0xd];
    cVar46 = pcVar1[0xe];
    cVar47 = pcVar1[0xf];
    for (uVar22 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar28[0xf] >> 7) << 0xf; uVar22 != 0; uVar22 = uVar22 - 1 & uVar22) {
      local_78 = cVar30;
      cStack_77 = cVar33;
      cStack_76 = cVar34;
      cStack_75 = cVar35;
      cStack_74 = cVar36;
      cStack_73 = cVar37;
      cStack_72 = cVar38;
      cStack_71 = cVar39;
      cStack_70 = cVar40;
      cStack_6f = cVar41;
      cStack_6e = cVar42;
      cStack_6d = cVar43;
      cStack_6c = cVar44;
      cStack_6b = cVar45;
      cStack_6a = cVar46;
      cStack_69 = cVar47;
      local_68 = auVar29;
      uVar14 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar22);
      lVar3 = *(long *)((long)&(pfVar20->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                               ).settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      uVar24 = local_98.offset_ + (ulong)uVar14 & local_98.mask_;
      lVar21 = uVar24 * 0x30;
      if ((*(MessageLite **)(lVar3 + lVar21) == key->message) &&
         (*(int *)(lVar3 + 8 + lVar21) == key->number)) {
        local_98._0_16_ =
             absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ::iterator_at(&pfVar20->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                           ,uVar24);
        goto LAB_001a066a;
      }
      aVar18 = (anon_union_8_1_a8a14541_for_iterator_2)local_98.offset_;
      auVar29 = local_68;
      cVar30 = local_78;
      cVar33 = cStack_77;
      cVar34 = cStack_76;
      cVar35 = cStack_75;
      cVar36 = cStack_74;
      cVar37 = cStack_73;
      cVar38 = cStack_72;
      cVar39 = cStack_71;
      cVar40 = cStack_70;
      cVar41 = cStack_6f;
      cVar42 = cStack_6e;
      cVar43 = cStack_6d;
      cVar44 = cStack_6c;
      cVar45 = cStack_6b;
      cVar46 = cStack_6a;
      cVar47 = cStack_69;
    }
    auVar32[0] = -(cVar30 == kEmpty);
    auVar32[1] = -(cVar33 == kEmpty);
    auVar32[2] = -(cVar34 == kEmpty);
    auVar32[3] = -(cVar35 == kEmpty);
    auVar32[4] = -(cVar36 == kEmpty);
    auVar32[5] = -(cVar37 == kEmpty);
    auVar32[6] = -(cVar38 == kEmpty);
    auVar32[7] = -(cVar39 == kEmpty);
    auVar32[8] = -(cVar40 == kEmpty);
    auVar32[9] = -(cVar41 == kEmpty);
    auVar32[10] = -(cVar42 == kEmpty);
    auVar32[0xb] = -(cVar43 == kEmpty);
    auVar32[0xc] = -(cVar44 == kEmpty);
    auVar32[0xd] = -(cVar45 == kEmpty);
    auVar32[0xe] = -(cVar46 == kEmpty);
    auVar32[0xf] = -(cVar47 == kEmpty);
    if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar47 == kEmpty) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ::AssertNotDebugCapacity
                (&pfVar20->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                );
      auVar5._8_8_ = 0;
      auVar5._0_8_ = extraout_RDX;
      local_98._0_16_ = auVar5 << 0x40;
LAB_001a066a:
      local_50.inner_.ctrl_ = (ctrl_t *)local_80;
      local_50.inner_.field_1 = aVar17;
      bVar13 = absl::lts_20250127::container_internal::operator==
                         ((const_iterator *)&local_98,&local_50);
      if (bVar13) {
        return;
      }
      __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xfe2,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, Args = <const google::protobuf::internal::ExtensionInfo &>]"
                   );
    }
    uVar24 = local_98.index_ + 0x10;
    aVar18.slot_ = (slot_type *)((long)&(aVar18.slot_)->field_6 + local_98.index_ & local_98.mask_);
    local_98.offset_ = (size_t)aVar18.slot_;
    local_98.index_ = uVar24;
    if ((pfVar20->
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
        ).settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < uVar24) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                   );
    }
  } while( true );
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!local_static_registry->insert(info).second) {
    ABSL_LOG(FATAL) << "Multiple extension registrations for type \""
                    << info.message->GetTypeName() << "\", field number "
                    << info.number << ".";
  }
}